

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.hpp
# Opt level: O2

void __thiscall
cfg::tag_int_scalar_t<cfgfile::qstring_trait_t>::tag_int_scalar_t
          (tag_int_scalar_t<cfgfile::qstring_trait_t> *this,tag_t<cfgfile::qstring_trait_t> *owner,
          string_t *name,bool is_mandatory)

{
  _Rb_tree_header *p_Var1;
  set<int,_std::less<int>,_std::allocator<int>_> *this_00;
  set<QString,_std::less<QString>,_std::allocator<QString>_> *this_01;
  allocator<char> local_51;
  string local_50;
  QArrayDataPointer<char16_t> local_30;
  
  cfgfile::tag_scalar_t<int,_cfgfile::qstring_trait_t>::tag_scalar_t
            (&this->super_tag_scalar_t<int,_cfgfile::qstring_trait_t>,owner,name,is_mandatory);
  (this->super_tag_scalar_t<int,_cfgfile::qstring_trait_t>).super_tag_t<cfgfile::qstring_trait_t>.
  _vptr_tag_t = (_func_int **)&PTR__tag_int_scalar_t_0013ead8;
  (this->m_int_scalar_constraint).super_constraint_t<int>._vptr_constraint_t =
       (_func_int **)&PTR__constraint_one_of_t_0013eb40;
  p_Var1 = &(this->m_int_scalar_constraint).m_list._M_t._M_impl.super__Rb_tree_header;
  (this->m_int_scalar_constraint).m_list._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->m_int_scalar_constraint).m_list._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_int_scalar_constraint).m_list._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_int_scalar_constraint).m_list._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_int_scalar_constraint).m_list._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"string_field",&local_51);
  cfgfile::qstring_trait_t::from_ascii((string_t *)&local_30,&local_50);
  cfgfile::tag_scalar_t<QString,_cfgfile::qstring_trait_t>::tag_scalar_t
            (&this->m_string_field,(tag_t<cfgfile::qstring_trait_t> *)this,(string_t *)&local_30,
             true);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  (this->m_string_field_constraint).super_constraint_t<QString>._vptr_constraint_t =
       (_func_int **)&PTR__constraint_one_of_t_0013e830;
  p_Var1 = &(this->m_string_field_constraint).m_list._M_t._M_impl.super__Rb_tree_header;
  (this->m_string_field_constraint).m_list._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->m_string_field_constraint).m_list._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_string_field_constraint).m_list._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_string_field_constraint).m_list._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_string_field_constraint).m_list._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_50._M_dataplus._M_p._0_4_ = 100;
  this_00 = &(this->m_int_scalar_constraint).m_list;
  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
  _M_insert_unique<int_const&>
            ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)this_00,
             (int *)&local_50);
  local_50._M_dataplus._M_p._0_4_ = 200;
  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
  _M_insert_unique<int_const&>
            ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)this_00,
             (int *)&local_50);
  local_50._M_dataplus._M_p._0_4_ = 300;
  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
  _M_insert_unique<int_const&>
            ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)this_00,
             (int *)&local_50);
  (this->super_tag_scalar_t<int,_cfgfile::qstring_trait_t>).m_constraint =
       &(this->m_int_scalar_constraint).super_constraint_t<int>;
  QString::QString((QString *)&local_50,"one");
  this_01 = &(this->m_string_field_constraint).m_list;
  std::_Rb_tree<QString,QString,std::_Identity<QString>,std::less<QString>,std::allocator<QString>>
  ::_M_insert_unique<QString_const&>
            ((_Rb_tree<QString,QString,std::_Identity<QString>,std::less<QString>,std::allocator<QString>>
              *)this_01,(QString *)&local_50);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_50);
  QString::QString((QString *)&local_50,"two");
  std::_Rb_tree<QString,QString,std::_Identity<QString>,std::less<QString>,std::allocator<QString>>
  ::_M_insert_unique<QString_const&>
            ((_Rb_tree<QString,QString,std::_Identity<QString>,std::less<QString>,std::allocator<QString>>
              *)this_01,(QString *)&local_50);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_50);
  QString::QString((QString *)&local_50,"three");
  std::_Rb_tree<QString,QString,std::_Identity<QString>,std::less<QString>,std::allocator<QString>>
  ::_M_insert_unique<QString_const&>
            ((_Rb_tree<QString,QString,std::_Identity<QString>,std::less<QString>,std::allocator<QString>>
              *)this_01,(QString *)&local_50);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_50);
  QString::QString((QString *)&local_50,"one\n\"\r\t\\");
  std::_Rb_tree<QString,QString,std::_Identity<QString>,std::less<QString>,std::allocator<QString>>
  ::_M_insert_unique<QString_const&>
            ((_Rb_tree<QString,QString,std::_Identity<QString>,std::less<QString>,std::allocator<QString>>
              *)this_01,(QString *)&local_50);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_50);
  (this->m_string_field).m_constraint =
       &(this->m_string_field_constraint).super_constraint_t<QString>;
  return;
}

Assistant:

tag_int_scalar_t( cfgfile::tag_t< Trait > & owner, const typename Trait::string_t & name, bool is_mandatory )
		:	cfgfile::tag_scalar_t< int, Trait >( owner, name, is_mandatory )
		,	m_string_field( *this, Trait::from_ascii( "string_field" ), true )
		,	m_string_field_constraint()
	{
		m_int_scalar_constraint.add_value( 100 );
		m_int_scalar_constraint.add_value( 200 );
		m_int_scalar_constraint.add_value( 300 );
		this->set_constraint( &m_int_scalar_constraint );

		m_string_field_constraint.add_value( "one" );
		m_string_field_constraint.add_value( "two" );
		m_string_field_constraint.add_value( "three" );
		m_string_field_constraint.add_value( "one\n\"\r\t\\" );
		m_string_field.set_constraint( &m_string_field_constraint );

	}